

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTree.cpp
# Opt level: O0

void __thiscall ASTree::toDot(ASTree *this,string *filename)

{
  string local_c0;
  allocator<char> local_89;
  string local_88;
  undefined1 auStack_68 [8];
  Graph graph;
  string *filename_local;
  ASTree *this_local;
  
  graph.rankdir._M_string_length = 0;
  graph.rankdir.field_2._M_allocated_capacity = 0;
  graph.connections.super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  graph.rankdir._M_dataplus = (_Alloc_hider)0x0;
  graph.rankdir._1_7_ = 0;
  graph.connections.super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  graph.connections.super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  graph.nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  graph.nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  auStack_68 = (undefined1  [8])0x0;
  graph.nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  graph.rankdir.field_2._8_8_ = filename;
  Graph::Graph((Graph *)auStack_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"TB",&local_89);
  Graph::setRankdir((Graph *)auStack_68,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  expandDot(this,(Graph *)auStack_68);
  std::__cxx11::string::string((string *)&local_c0,(string *)filename);
  Graph::build_file((Graph *)auStack_68,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  Graph::~Graph((Graph *)auStack_68);
  return;
}

Assistant:

void ASTree::toDot(std::string filename) {
    Graph graph = Graph();
    graph.setRankdir("TB");
    expandDot(graph);
    graph.build_file(filename);
}